

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O0

float __thiscall
Rml::ElementAnimation::GetInterpolationFactorAndKeys
          (ElementAnimation *this,int *out_key0,int *out_key1)

{
  code *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  float fVar5;
  int local_50;
  float eps;
  float t1;
  float t0;
  float alpha;
  int i;
  int key1;
  int key0;
  float t;
  int *out_key1_local;
  int *out_key0_local;
  ElementAnimation *this_local;
  
  key1 = (int)this->time_since_iteration_start;
  if ((this->reverse_direction & 1U) != 0) {
    key1 = (int)(this->duration - (float)key1);
  }
  alpha = -NAN;
  t0 = 0.0;
  do {
    sVar3 = ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::size(&this->keys);
    if ((int)sVar3 <= (int)t0) {
LAB_005684e1:
      if ((int)alpha < 0) {
        sVar3 = ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::size
                          (&this->keys);
        alpha = (float)((int)sVar3 + -1);
      }
      if (alpha == 0.0) {
        local_50 = 0;
      }
      else {
        local_50 = (int)alpha + -1;
      }
      if (((((local_50 < 0) ||
            (sVar3 = ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::size
                               (&this->keys), (int)sVar3 <= local_50)) || ((int)alpha < 0)) ||
          (sVar3 = ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::size
                             (&this->keys), (int)sVar3 <= (int)alpha)) &&
         (bVar2 = Assert("RMLUI_ASSERT(key0 >= 0 && key0 < (int)keys.size() && key1 >= 0 && key1 < (int)keys.size())"
                         ,
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                         ,0x2e3), !bVar2)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      t1 = 0.0;
      pvVar4 = ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::operator[]
                         (&this->keys,(long)local_50);
      fVar5 = pvVar4->time;
      pvVar4 = ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::operator[]
                         (&this->keys,(long)(int)alpha);
      if (0.001 < pvVar4->time - fVar5) {
        t1 = ((float)key1 - fVar5) / (pvVar4->time - fVar5);
      }
      fVar5 = Math::Clamp<float>(t1,0.0,1.0);
      pvVar4 = ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::operator[]
                         (&this->keys,(long)(int)alpha);
      fVar5 = Tween::operator()(&pvVar4->tween,fVar5);
      if (out_key0 != (int *)0x0) {
        *out_key0 = local_50;
      }
      if (out_key1 != (int *)0x0) {
        *out_key1 = (int)alpha;
      }
      return fVar5;
    }
    pvVar4 = ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::operator[]
                       (&this->keys,(long)(int)t0);
    if ((float)key1 <= pvVar4->time) {
      alpha = t0;
      goto LAB_005684e1;
    }
    t0 = (float)((int)t0 + 1);
  } while( true );
}

Assistant:

float ElementAnimation::GetInterpolationFactorAndKeys(int* out_key0, int* out_key1) const
{
	float t = time_since_iteration_start;

	if (reverse_direction)
		t = duration - t;

	int key0 = -1;
	int key1 = -1;

	{
		for (int i = 0; i < (int)keys.size(); i++)
		{
			if (keys[i].time >= t)
			{
				key1 = i;
				break;
			}
		}

		if (key1 < 0)
			key1 = (int)keys.size() - 1;
		key0 = (key1 == 0 ? 0 : key1 - 1);
	}

	RMLUI_ASSERT(key0 >= 0 && key0 < (int)keys.size() && key1 >= 0 && key1 < (int)keys.size());

	float alpha = 0.0f;

	{
		const float t0 = keys[key0].time;
		const float t1 = keys[key1].time;

		const float eps = 1e-3f;

		if (t1 - t0 > eps)
			alpha = (t - t0) / (t1 - t0);

		alpha = Math::Clamp(alpha, 0.0f, 1.0f);
	}

	alpha = keys[key1].tween(alpha);

	if (out_key0)
		*out_key0 = key0;
	if (out_key1)
		*out_key1 = key1;

	return alpha;
}